

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O3

ArgumentMismatch *
CLI::ArgumentMismatch::AtMost
          (ArgumentMismatch *__return_storage_ptr__,string *name,int num,size_t received)

{
  size_type *psVar1;
  pointer pcVar2;
  bool bVar3;
  uint uVar4;
  char cVar5;
  undefined8 *puVar6;
  long *plVar7;
  uint uVar8;
  ulong *puVar9;
  size_t sVar10;
  ulong uVar11;
  uint __val;
  char cVar12;
  ulong uVar13;
  uint __len;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string __str_2;
  string __str_1;
  ulong *local_f0;
  long local_e8;
  ulong local_e0 [2];
  long *local_d0;
  undefined8 local_c8;
  long local_c0;
  undefined8 uStack_b8;
  string local_b0;
  ulong *local_90;
  uint local_88;
  undefined4 uStack_84;
  ulong local_80 [2];
  ulong *local_70;
  long local_68;
  ulong local_60;
  long lStack_58;
  ulong *local_50;
  long local_48;
  ulong local_40 [2];
  
  local_f0 = local_e0;
  pcVar2 = (name->_M_dataplus)._M_p;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_f0,pcVar2,pcVar2 + name->_M_string_length);
  ::std::__cxx11::string::append((char *)&local_f0);
  __val = -num;
  if (0 < num) {
    __val = num;
  }
  __len = 1;
  if (9 < __val) {
    uVar11 = (ulong)__val;
    uVar4 = 4;
    do {
      __len = uVar4;
      uVar8 = (uint)uVar11;
      if (uVar8 < 100) {
        __len = __len - 2;
        goto LAB_0011b283;
      }
      if (uVar8 < 1000) {
        __len = __len - 1;
        goto LAB_0011b283;
      }
      if (uVar8 < 10000) goto LAB_0011b283;
      uVar11 = uVar11 / 10000;
      uVar4 = __len + 4;
    } while (99999 < uVar8);
    __len = __len + 1;
  }
LAB_0011b283:
  local_50 = local_40;
  ::std::__cxx11::string::_M_construct((ulong)&local_50,(char)__len - (char)(num >> 0x1f));
  std::__detail::__to_chars_10_impl<unsigned_int>
            ((char *)((ulong)((uint)num >> 0x1f) + (long)local_50),__len,__val);
  uVar11 = 0xf;
  if (local_f0 != local_e0) {
    uVar11 = local_e0[0];
  }
  if (uVar11 < (ulong)(local_48 + local_e8)) {
    uVar11 = 0xf;
    if (local_50 != local_40) {
      uVar11 = local_40[0];
    }
    if (uVar11 < (ulong)(local_48 + local_e8)) goto LAB_0011b30c;
    puVar6 = (undefined8 *)
             ::std::__cxx11::string::replace((ulong)&local_50,0,(char *)0x0,(ulong)local_f0);
  }
  else {
LAB_0011b30c:
    puVar6 = (undefined8 *)::std::__cxx11::string::_M_append((char *)&local_f0,(ulong)local_50);
  }
  local_d0 = &local_c0;
  plVar7 = puVar6 + 2;
  if ((long *)*puVar6 == plVar7) {
    local_c0 = *plVar7;
    uStack_b8 = puVar6[3];
  }
  else {
    local_c0 = *plVar7;
    local_d0 = (long *)*puVar6;
  }
  local_c8 = puVar6[1];
  *puVar6 = plVar7;
  puVar6[1] = 0;
  *(undefined1 *)plVar7 = 0;
  plVar7 = (long *)::std::__cxx11::string::append((char *)&local_d0);
  puVar9 = (ulong *)(plVar7 + 2);
  if ((ulong *)*plVar7 == puVar9) {
    local_60 = *puVar9;
    lStack_58 = plVar7[3];
    local_70 = &local_60;
  }
  else {
    local_60 = *puVar9;
    local_70 = (ulong *)*plVar7;
  }
  local_68 = plVar7[1];
  *plVar7 = (long)puVar9;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  cVar12 = '\x01';
  if (9 < received) {
    sVar10 = received;
    cVar5 = '\x04';
    do {
      cVar12 = cVar5;
      if (sVar10 < 100) {
        cVar12 = cVar12 + -2;
        goto LAB_0011b42d;
      }
      if (sVar10 < 1000) {
        cVar12 = cVar12 + -1;
        goto LAB_0011b42d;
      }
      if (sVar10 < 10000) goto LAB_0011b42d;
      bVar3 = 99999 < sVar10;
      sVar10 = sVar10 / 10000;
      cVar5 = cVar12 + '\x04';
    } while (bVar3);
    cVar12 = cVar12 + '\x01';
  }
LAB_0011b42d:
  local_90 = local_80;
  ::std::__cxx11::string::_M_construct((ulong)&local_90,cVar12);
  std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_90,local_88,received);
  uVar11 = CONCAT44(uStack_84,local_88) + local_68;
  uVar13 = 0xf;
  if (local_70 != &local_60) {
    uVar13 = local_60;
  }
  if (uVar13 < uVar11) {
    uVar13 = 0xf;
    if (local_90 != local_80) {
      uVar13 = local_80[0];
    }
    if (uVar11 <= uVar13) {
      puVar6 = (undefined8 *)
               ::std::__cxx11::string::replace((ulong)&local_90,0,(char *)0x0,(ulong)local_70);
      goto LAB_0011b4bc;
    }
  }
  puVar6 = (undefined8 *)::std::__cxx11::string::_M_append((char *)&local_70,(ulong)local_90);
LAB_0011b4bc:
  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  psVar1 = puVar6 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar6 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar1) {
    local_b0.field_2._M_allocated_capacity = *psVar1;
    local_b0.field_2._8_8_ = puVar6[3];
  }
  else {
    local_b0.field_2._M_allocated_capacity = *psVar1;
    local_b0._M_dataplus._M_p = (pointer)*puVar6;
  }
  local_b0._M_string_length = puVar6[1];
  *puVar6 = psVar1;
  puVar6[1] = 0;
  *(undefined1 *)psVar1 = 0;
  ArgumentMismatch(__return_storage_ptr__,&local_b0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
  if (local_90 != local_80) {
    operator_delete(local_90,local_80[0] + 1);
  }
  if (local_70 != &local_60) {
    operator_delete(local_70,local_60 + 1);
  }
  if (local_d0 != &local_c0) {
    operator_delete(local_d0,local_c0 + 1);
  }
  if (local_50 != local_40) {
    operator_delete(local_50,local_40[0] + 1);
  }
  if (local_f0 != local_e0) {
    operator_delete(local_f0,local_e0[0] + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

static ArgumentMismatch AtMost(std::string name, int num, std::size_t received) {
        return ArgumentMismatch(name + ": At Most " + std::to_string(num) + " required but received " +
                                std::to_string(received));
    }